

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3InvalidFunction(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  char *z;
  
  z = sqlite3_mprintf("unable to use function %s in the requested context",context->pFunc->zName);
  context->isError = 1;
  context->fErrorOrAux = '\x01';
  sqlite3VdbeMemSetStr(context->pOut,z,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3_free(z);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3InvalidFunction(
  sqlite3_context *context,  /* The function calling context */
  int NotUsed,               /* Number of arguments to the function */
  sqlite3_value **NotUsed2   /* Value of each argument */
){
  const char *zName = context->pFunc->zName;
  char *zErr;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  zErr = sqlite3_mprintf(
      "unable to use function %s in the requested context", zName);
  sqlite3_result_error(context, zErr, -1);
  sqlite3_free(zErr);
}